

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void LiteScript::StateExecutor::I_JUMP_IF(State *state,Instruction *instr)

{
  bool bVar1;
  size_type sVar2;
  Type *pTVar3;
  Object *pOVar4;
  bool *pbVar5;
  undefined1 local_48 [8];
  Variable tmp;
  undefined1 local_28 [8];
  Variable v1;
  Instruction *instr_local;
  State *state_local;
  
  state->line_num = state->line_num + 1;
  v1.nb_ref = (uint *)instr;
  sVar2 = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::size
                    (&state->op_lifo);
  if (sVar2 == 0) {
    return;
  }
  if (*(char *)((long)v1.nb_ref + 1) != '\x02') {
    return;
  }
  pTVar3 = (Type *)std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                             (&state->op_lifo);
  Variable::Convert((Variable *)local_28,pTVar3);
  PopValue(state);
  pOVar4 = Variable::operator->((Variable *)local_28);
  pTVar3 = Object::GetType(pOVar4);
  bVar1 = Type::operator==(pTVar3,(Type *)_type_boolean);
  if (bVar1) {
    pOVar4 = Variable::operator->((Variable *)local_28);
    pbVar5 = Object::GetData<bool>(pOVar4);
    if ((*pbVar5 & 1U) != 0) {
      state->line_num = v1.nb_ref[2];
      goto LAB_00168fae;
    }
  }
  Variable::Convert((Variable *)local_48,(Type *)local_28);
  pOVar4 = Variable::operator->((Variable *)local_48);
  pTVar3 = Object::GetType(pOVar4);
  bVar1 = Type::operator==(pTVar3,(Type *)_type_boolean);
  if (bVar1) {
    pOVar4 = Variable::operator->((Variable *)local_48);
    pbVar5 = Object::GetData<bool>(pOVar4);
    if ((*pbVar5 & 1U) != 0) {
      state->line_num = v1.nb_ref[2];
    }
  }
  Variable::~Variable((Variable *)local_48);
LAB_00168fae:
  Variable::~Variable((Variable *)local_28);
  return;
}

Assistant:

void LiteScript::StateExecutor::I_JUMP_IF(State& state, Instruction& instr) {
    state.line_num++;
    if (state.op_lifo.size() < 1 || instr.comp_type != Instruction::CompType::COMP_TYPE_INTEGER)
        return;
    Variable v1(state.op_lifo.back().Convert(Type::BOOLEAN));
    PopValue(state);
    if (v1->GetType() == Type::BOOLEAN && v1->GetData<bool>())
        state.line_num = (unsigned int) instr.comp_value.v_integer;
    else {
        Variable tmp = v1.Convert(Type::BOOLEAN);
        if (tmp->GetType() == Type::BOOLEAN && tmp->GetData<bool>())
            state.line_num = (unsigned int) instr.comp_value.v_integer;
    }
}